

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O0

uint32_t FastPForLib::Simple8b_Codec::Decompress
                   (uint64_t *input,uint32_t param_2,uint32_t *output,uint32_t outOffset,
                   uint32_t outCount)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  byte bVar5;
  uint32_t uVar6;
  uint local_78;
  uint local_74;
  uint32_t *out_1;
  uint32_t *out;
  uint32_t i_1;
  uint64_t bitMask;
  uint32_t bitLen;
  uint32_t intNum;
  uint32_t i;
  uint32_t repeatCount;
  uint32_t repeatValue;
  uint32_t code;
  uint64_t val;
  uint32_t remainingCount;
  uint32_t outEnd;
  uint32_t outPos;
  uint32_t inPos;
  uint32_t outCount_local;
  uint32_t outOffset_local;
  uint32_t *output_local;
  uint32_t param_1_local;
  uint64_t *input_local;
  
  inPos = 0;
  outPos = outOffset;
  while( true ) {
    if (outOffset + outCount <= outPos) {
      return inPos;
    }
    local_78 = (outOffset + outCount) - outPos;
    uVar6 = inPos + 1;
    val = input[inPos];
    uVar2 = (uint)(val >> 0x20);
    uVar1 = uVar2 >> 0x1c;
    if (uVar1 == 0) break;
    inPos = uVar6;
    if (uVar1 == 0xf) {
      uVar2 = uVar2 & 0xfffffff;
      local_74 = local_78;
      if (uVar2 < local_78) {
        local_74 = uVar2;
      }
      for (i = 0; i < local_74; i = i + 1) {
        output[outPos] = (uint32_t)val;
        outPos = outPos + 1;
      }
    }
    else {
      bVar5 = (byte)*(undefined4 *)(Simple8b_Codec_bitLength + (ulong)uVar1 * 4);
      uVar2 = (int)(1L << (bVar5 & 0x3f)) - 1;
      if (*(uint *)(Simple8b_Codec_bitLength + (ulong)(0xf - uVar1) * 4) < local_78) {
        local_78 = *(uint *)(Simple8b_Codec_bitLength + (ulong)(0xf - uVar1) * 4);
      }
      for (i_1 = 0; i_1 < local_78; i_1 = i_1 + 8) {
        puVar3 = output + (ulong)outPos + (ulong)i_1;
        *puVar3 = (uint)val & uVar2;
        uVar4 = val >> (bVar5 & 0x3f);
        puVar3[1] = (uint)uVar4 & uVar2;
        uVar4 = uVar4 >> (bVar5 & 0x3f);
        puVar3[2] = (uint)uVar4 & uVar2;
        uVar4 = uVar4 >> (bVar5 & 0x3f);
        puVar3[3] = (uint)uVar4 & uVar2;
        uVar4 = uVar4 >> (bVar5 & 0x3f);
        puVar3[4] = (uint)uVar4 & uVar2;
        uVar4 = uVar4 >> (bVar5 & 0x3f);
        puVar3[5] = (uint)uVar4 & uVar2;
        uVar4 = uVar4 >> (bVar5 & 0x3f);
        puVar3[6] = (uint)uVar4 & uVar2;
        uVar4 = uVar4 >> (bVar5 & 0x3f);
        puVar3[7] = (uint)uVar4 & uVar2;
        val = uVar4 >> (bVar5 & 0x3f);
      }
      for (; i_1 < local_78; i_1 = i_1 + 1) {
        output[(ulong)outPos + (ulong)i_1] = (uint)val & uVar2;
        val = val >> (bVar5 & 0x3f);
      }
      outPos = local_78 + outPos;
    }
  }
  return uVar6;
}

Assistant:

static uint32_t Decompress(const uint64_t *input, uint32_t,
                             uint32_t *output, uint32_t outOffset,
                             uint32_t outCount) {
    uint32_t inPos = 0;
    uint32_t outPos = outOffset;
    uint32_t outEnd = outOffset + outCount;

    while (outPos < outEnd) {
      uint32_t remainingCount = outEnd - outPos;

      uint64_t val = input[inPos++];
      uint32_t code = static_cast<uint32_t>(val >> SIMPLE8B_BITSIZE);

      // optional check for end-of-stream
      if (code == 0) {
        break; // end of stream
      }

#if defined(_SIMPLE8B_USE_RLE)
      else if (code == SIMPLE8B_MAXCODE) {
        // decode rle-encoded integers
        uint32_t repeatValue = static_cast<uint32_t>(val & RLE_MAX_VALUE_MASK);
        uint32_t repeatCount = static_cast<uint32_t>(
            (val >> RLE_MAX_VALUE_BITS) & RLE_MAX_COUNT_MASK);
        repeatCount =
            (repeatCount < remainingCount) ? repeatCount : remainingCount;

        for (uint32_t i = 0; i < repeatCount; ++i) {
          output[outPos++] = repeatValue;
        }
      }
#endif
      else {
        // decode bit-packed integers
        uint32_t intNum = Simple8b_Codec_bitLength[SIMPLE8B_MAXCODE - code];
        uint32_t bitLen = Simple8b_Codec_bitLength[code];
        uint64_t bitMask = (1ULL << bitLen) - 1;
        intNum = (intNum < remainingCount)
                     ? intNum
                     : remainingCount; // optional buffer end check

#if defined(_DONT_UNROLL_LOOP)
        for (uint32_t i = 0; i < intNum; ++i) {
          output[outPos++] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
        }
#else
        uint32_t i = 0;
        for (; i < intNum; i += 8) {
          auto out = output + outPos + i;
          out[0] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[1] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[2] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[3] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[4] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[5] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[6] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[7] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
        }
        for (; i < intNum; ++i) {
          auto out = output + outPos + i;
          out[0] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
        }
        outPos += intNum;
#endif
      }
    }